

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEseqFloatVisitor.cpp
# Opt level: O1

void __thiscall
IRT::CEseqFloatVisitor::Visit(CEseqFloatVisitor *this,CJumpConditionalStatement *statement)

{
  undefined8 uVar1;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> _Var2;
  TLogicOperator TVar3;
  CExpression *pCVar4;
  CEseqExpression *pCVar5;
  long lVar6;
  CJumpConditionalStatement *pCVar7;
  CStatement *pCVar8;
  CExpression *pCVar9;
  CEseqExpression *rightEseq;
  pointer_____offset_0x10___ *cjump;
  INode *pIVar10;
  undefined1 local_c0 [16];
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  _Head_base<0UL,_const_IRT::CLabelStatement_*,_false> local_70;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_68;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_60;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_58;
  _Head_base<0UL,_const_IRT::CLabelStatement_*,_false> local_50;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_48;
  _Head_base<0UL,_const_IRT::CLabelStatement_*,_false> local_40;
  CJumpConditionalStatement *local_38;
  
  pCVar4 = CJumpConditionalStatement::LeftOperand(statement);
  (**(pCVar4->super_IExpression).super_INode._vptr_INode)(pCVar4,this);
  rightEseq = (CEseqExpression *)
              (this->childExpression)._M_t.
              super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
              ._M_t.
              super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
              .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl;
  (this->childExpression)._M_t.
  super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>._M_t.
  super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
  super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl = (CExpression *)0x0;
  pCVar4 = CJumpConditionalStatement::RightOperand(statement);
  cjump = (pointer_____offset_0x10___ *)this;
  (**(pCVar4->super_IExpression).super_INode._vptr_INode)(pCVar4);
  pCVar4 = (this->childExpression)._M_t.
           super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
           .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl;
  (this->childExpression)._M_t.
  super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>._M_t.
  super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
  super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl = (CExpression *)0x0;
  if (rightEseq == (CEseqExpression *)0x0) {
    pCVar5 = (CEseqExpression *)0x0;
  }
  else {
    cjump = &CExpression::typeinfo;
    pCVar5 = (CEseqExpression *)
             __dynamic_cast(rightEseq,&CExpression::typeinfo,&CEseqExpression::typeinfo,0);
  }
  if (pCVar4 == (CExpression *)0x0) {
    lVar6 = 0;
  }
  else {
    cjump = &CExpression::typeinfo;
    lVar6 = __dynamic_cast(pCVar4,&CExpression::typeinfo,&CEseqExpression::typeinfo,0);
  }
  if (pCVar5 == (CEseqExpression *)0x0 && lVar6 == 0) {
    pCVar7 = (CJumpConditionalStatement *)operator_new(0x30);
    TVar3 = CJumpConditionalStatement::Operation(statement);
    local_68._M_head_impl = pCVar4;
    local_60._M_head_impl = (CExpression *)rightEseq;
    CJumpConditionalStatement::TrueLabel(statement);
    CLabelStatement::CastCopy((CLabelStatement *)local_c0);
    local_70._M_head_impl = (CLabelStatement *)local_c0._0_8_;
    local_c0._0_8_ = (INode *)0x0;
    CJumpConditionalStatement::FalseLabel(statement);
    CLabelStatement::CastCopy((CLabelStatement *)(local_c0 + 8));
    local_40._M_head_impl = (CLabelStatement *)local_c0._8_8_;
    local_c0._8_8_ = (long *)0x0;
    CJumpConditionalStatement::CJumpConditionalStatement
              (pCVar7,TVar3,
               (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
               &local_60,
               (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
               &local_68,
               (unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
                *)&local_70,
               (unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
                *)&local_40);
    pCVar8 = (this->childStatement)._M_t.
             super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>
             .super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl;
    (this->childStatement)._M_t.
    super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>._M_t.
    super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>.
    super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl = (CStatement *)pCVar7;
    if (pCVar8 != (CStatement *)0x0) {
      (**(code **)((long)(pCVar8->super_IStatement).super_INode + 0x10))();
    }
    if (local_40._M_head_impl != (CLabelStatement *)0x0) {
      (*((local_40._M_head_impl)->super_CStatement).super_IStatement.super_INode._vptr_INode[2])();
    }
    local_40._M_head_impl = (CLabelStatement *)0x0;
    if ((long *)local_c0._8_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_c0._8_8_ + 0x10))();
    }
    if (local_70._M_head_impl != (CLabelStatement *)0x0) {
      (*((local_70._M_head_impl)->super_CStatement).super_IStatement.super_INode._vptr_INode[2])();
    }
    local_70._M_head_impl = (CLabelStatement *)0x0;
    if ((INode *)local_c0._0_8_ != (INode *)0x0) {
      (*(*(_func_int ***)local_c0._0_8_)[2])();
    }
    if (local_68._M_head_impl != (CExpression *)0x0) {
      (*((local_68._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
    }
    local_68._M_head_impl = (CExpression *)0x0;
    if ((CEseqExpression *)local_60._M_head_impl != (CEseqExpression *)0x0) {
      (*(((CExpression *)&(local_60._M_head_impl)->super_IExpression)->super_IExpression).
        super_INode._vptr_INode[2])();
    }
    local_60._M_head_impl = (CExpression *)0x0;
    rightEseq = (CEseqExpression *)0x0;
LAB_00139e0b:
    pCVar4 = (CExpression *)0x0;
  }
  else {
    if ((pCVar5 == (CEseqExpression *)0x0) && (lVar6 != 0)) {
      processRightEseqInCJump
                ((CEseqFloatVisitor *)local_c0,(CJumpConditionalStatement *)cjump,
                 (CExpression *)statement,rightEseq);
      uVar1 = local_c0._0_8_;
      local_c0._0_8_ = (INode *)0x0;
      pIVar10 = (INode *)(this->childStatement)._M_t.
                         super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>
                         .super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl;
      (this->childStatement)._M_t.
      super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>._M_t
      .super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>.
      super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl = (CStatement *)uVar1;
    }
    else {
      if ((pCVar5 != (CEseqExpression *)0x0) && (lVar6 == 0)) {
        local_b0._M_head_impl = (CExpression *)operator_new(0x18);
        pCVar8 = CEseqExpression::getStatement(pCVar5);
        (*(pCVar8->super_IStatement).super_INode._vptr_INode[3])(local_c0,pCVar8);
        local_80._8_8_ = local_c0._0_8_;
        local_c0._0_8_ = (INode *)0x0;
        local_38 = (CJumpConditionalStatement *)operator_new(0x30);
        TVar3 = CJumpConditionalStatement::Operation(statement);
        pCVar9 = CEseqExpression::getExpression(pCVar5);
        (*(pCVar9->super_IExpression).super_INode._vptr_INode[3])(local_c0 + 8,pCVar9);
        local_80._M_allocated_capacity = local_c0._8_8_;
        local_c0._8_8_ = (long *)0x0;
        local_98._16_8_ = pCVar4;
        CJumpConditionalStatement::TrueLabel(statement);
        CLabelStatement::CastCopy((CLabelStatement *)local_98);
        local_98._8_8_ = local_98._0_8_;
        local_98._0_8_ = (_func_int **)0x0;
        CJumpConditionalStatement::FalseLabel(statement);
        CLabelStatement::CastCopy((CLabelStatement *)(local_a8 + 8));
        pCVar7 = local_38;
        _Var2._M_head_impl = local_b0._M_head_impl;
        local_50._M_head_impl = (CLabelStatement *)local_a8._8_8_;
        local_a8._8_8_ = (long *)0x0;
        CJumpConditionalStatement::CJumpConditionalStatement
                  (local_38,TVar3,
                   (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                    *)(local_98 + 0x18),
                   (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                    *)(local_98 + 0x10),
                   (unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
                    *)(local_98 + 8),
                   (unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
                    *)&local_50);
        local_48._M_head_impl = &pCVar7->super_CStatement;
        CSeqStatement::CSeqStatement
                  ((CSeqStatement *)_Var2._M_head_impl,
                   (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *
                   )((long)local_98 + 0x20),
                   (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *
                   )&local_48);
        pCVar8 = (this->childStatement)._M_t.
                 super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>
                 .super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl;
        (this->childStatement)._M_t.
        super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>.
        _M_t.
        super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>
        .super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl =
             (CStatement *)_Var2._M_head_impl;
        if (pCVar8 != (CStatement *)0x0) {
          (**(code **)((long)(pCVar8->super_IStatement).super_INode + 0x10))();
        }
        if ((CJumpConditionalStatement *)local_48._M_head_impl != (CJumpConditionalStatement *)0x0)
        {
          (*((INode *)&((local_48._M_head_impl)->super_IStatement).super_INode._vptr_INode)->
            _vptr_INode[2])();
        }
        local_48._M_head_impl = (CStatement *)0x0;
        if (local_50._M_head_impl != (CLabelStatement *)0x0) {
          (*((local_50._M_head_impl)->super_CStatement).super_IStatement.super_INode._vptr_INode[2])
                    ();
        }
        local_50._M_head_impl = (CLabelStatement *)0x0;
        if ((long *)local_a8._8_8_ != (long *)0x0) {
          (**(code **)(*(long *)local_a8._8_8_ + 0x10))();
        }
        if ((_func_int **)local_98._8_8_ != (_func_int **)0x0) {
          (**(code **)(*(_func_int **)local_98._8_8_ + 0x10))();
        }
        local_98._8_8_ = (pointer)0x0;
        if ((_func_int **)local_98._0_8_ != (_func_int **)0x0) {
          (**(code **)(*(_func_int **)local_98._0_8_ + 0x10))();
        }
        if ((CExpression *)local_98._16_8_ != (CExpression *)0x0) {
          (*(((IExpression *)local_98._16_8_)->super_INode)._vptr_INode[2])();
        }
        local_98._16_8_ = 0;
        if ((long *)local_80._M_allocated_capacity != (long *)0x0) {
          (**(code **)(*(long *)local_80._M_allocated_capacity + 0x10))();
        }
        local_80._M_allocated_capacity = 0;
        if ((long *)local_c0._8_8_ != (long *)0x0) {
          (**(code **)(*(long *)local_c0._8_8_ + 0x10))();
        }
        if ((INode *)local_80._8_8_ != (INode *)0x0) {
          (*(*(_func_int ***)local_80._8_8_)[2])();
        }
        local_80._8_8_ = 0;
        if ((_func_int **)local_c0._0_8_ != (_func_int **)0x0) {
          (*(*(_func_int ***)local_c0._0_8_)[2])();
        }
        goto LAB_00139e0b;
      }
      if ((pCVar5 == (CEseqExpression *)0x0) || (lVar6 == 0)) goto LAB_00139e4e;
      local_b0._M_head_impl = (CExpression *)operator_new(0x18);
      pCVar7 = (CJumpConditionalStatement *)CEseqExpression::getStatement(pCVar5);
      (*(pCVar7->super_CStatement).super_IStatement.super_INode._vptr_INode[3])(local_c0);
      local_a8._0_8_ = local_c0._0_8_;
      local_c0._0_8_ = (INode *)0x0;
      pCVar5 = (CEseqExpression *)CEseqExpression::getExpression(pCVar5);
      processRightEseqInCJump
                ((CEseqFloatVisitor *)(local_c0 + 8),pCVar7,(CExpression *)statement,pCVar5);
      _Var2._M_head_impl = local_b0._M_head_impl;
      local_58._M_head_impl = (CStatement *)local_c0._8_8_;
      local_c0._8_8_ = (long *)0x0;
      CSeqStatement::CSeqStatement
                ((CSeqStatement *)local_b0._M_head_impl,
                 (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
                 local_a8,(unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                           *)&local_58);
      pCVar8 = (this->childStatement)._M_t.
               super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
               ._M_t.
               super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>
               .super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl;
      (this->childStatement)._M_t.
      super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>._M_t
      .super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>.
      super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl =
           (CStatement *)_Var2._M_head_impl;
      if (pCVar8 != (CStatement *)0x0) {
        (**(code **)((long)(pCVar8->super_IStatement).super_INode + 0x10))();
      }
      if (local_58._M_head_impl != (CStatement *)0x0) {
        (*((local_58._M_head_impl)->super_IStatement).super_INode._vptr_INode[2])();
      }
      local_58._M_head_impl = (CStatement *)0x0;
      if ((INode *)local_a8._0_8_ != (INode *)0x0) {
        (*(*(_func_int ***)local_a8._0_8_)[2])();
      }
      local_a8._0_8_ = 0;
      pIVar10 = (INode *)local_c0._0_8_;
    }
    if (pIVar10 != (INode *)0x0) {
      (*(((IStatement *)&pIVar10->_vptr_INode)->super_INode)._vptr_INode[2])();
    }
  }
LAB_00139e4e:
  if (pCVar4 != (CExpression *)0x0) {
    (*(pCVar4->super_IExpression).super_INode._vptr_INode[2])(pCVar4);
  }
  if (rightEseq != (CEseqExpression *)0x0) {
    (*(rightEseq->super_CExpression).super_IExpression.super_INode._vptr_INode[2])(rightEseq);
  }
  return;
}

Assistant:

void IRT::CEseqFloatVisitor::Visit(const IRT::CJumpConditionalStatement &statement) {
    statement.LeftOperand()->Accept(*this);
    std::unique_ptr<const CExpression> left = std::move(childExpression);

    statement.RightOperand()->Accept(*this);
    std::unique_ptr<const CExpression> right = std::move(childExpression);

    const CEseqExpression* leftEseq = CAST_TO_ESEQ(left.get());
    const CEseqExpression* rightEseq = CAST_TO_ESEQ(right.get());

    if (leftEseq == nullptr && rightEseq == nullptr) {
        childStatement = SMOVE_UNIQ(new CJumpConditionalStatement(
                statement.Operation(),
                std::move(left),
                std::move(right),
                std::move(statement.TrueLabel()->CastCopy()),
                std::move(statement.FalseLabel()->CastCopy())
        ));

        return;
    }

    if (leftEseq == nullptr && rightEseq != nullptr) {
        childStatement = std::move(processRightEseqInCJump(&statement, left.get(), rightEseq));
        return;
    }

    if (leftEseq != nullptr && rightEseq == nullptr) {
        childStatement = SMOVE_UNIQ(new CSeqStatement(
                std::move(leftEseq->getStatement()->Copy()),
                SMOVE_UNIQ(new CJumpConditionalStatement(
                        statement.Operation(),
                        std::move(leftEseq->getExpression()->Copy()),
                        std::move(right),
                        std::move(statement.TrueLabel()->CastCopy()),
                        std::move(statement.FalseLabel()->CastCopy())
                ))
        ));
        return;
    }

    if (leftEseq != nullptr && rightEseq != nullptr) {
        childStatement = SMOVE_UNIQ(new CSeqStatement(
                std::move(leftEseq->getStatement()->Copy()),
                std::move(processRightEseqInCJump(&statement, leftEseq->getExpression(), rightEseq))
        ));

        return;
    }
}